

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_secret_info.cpp
# Opt level: O1

void __thiscall duckdb::CreateSecretInfo::~CreateSecretInfo(CreateSecretInfo *this)

{
  ~CreateSecretInfo(this);
  operator_delete(this);
  return;
}

Assistant:

CreateSecretInfo::~CreateSecretInfo() {
}